

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tap.c
# Opt level: O3

int exit_status(void)

{
  char *pcVar1;
  int iVar2;
  
  if (expected_tests == -1) {
    iVar2 = 0;
    printf("1..%d\n",(ulong)(uint)current_test);
  }
  else {
    iVar2 = 0;
    if (current_test != expected_tests) {
      pcVar1 = "";
      if (1 < expected_tests) {
        pcVar1 = "s";
      }
      diag("Looks like you planned %d test%s but ran %d.",(ulong)(uint)expected_tests,pcVar1);
      iVar2 = 2;
    }
  }
  if (failed_tests != 0) {
    pcVar1 = "";
    if (1 < failed_tests) {
      pcVar1 = "s";
    }
    diag("Looks like you failed %d test%s of %d run.",(ulong)(uint)failed_tests,pcVar1,
         (ulong)(uint)current_test);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int
exit_status () {
    int retval = 0;
    if (expected_tests == NO_PLAN) {
        printf("1..%d\n", current_test);
    }
    else if (current_test != expected_tests) {
        diag("Looks like you planned %d test%s but ran %d.",
            expected_tests, expected_tests > 1 ? "s" : "", current_test);
        retval = 2;
    }
    if (failed_tests) {
        diag("Looks like you failed %d test%s of %d run.",
            failed_tests, failed_tests > 1 ? "s" : "", current_test);
        retval = 1;
    }
    return retval;
}